

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

bool __thiscall argo::json::string_equal(json *this,json *other)

{
  pointer __n;
  int iVar1;
  json_exception *this_00;
  bool bVar2;
  
  if ((other->m_raw_value)._M_string_length == 0 && (this->m_raw_value)._M_string_length == 0) {
    __n = (pointer)(this->m_value).u_string._M_string_length;
    if (__n == (other->m_value).u_array.
               super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
      if (__n == (pointer)0x0) {
        bVar2 = true;
      }
      else {
        iVar1 = bcmp((this->m_value).u_array.
                     super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (other->m_value).u_array.
                     super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,(size_t)__n);
        bVar2 = iVar1 == 0;
      }
    }
    else {
      bVar2 = false;
    }
    return bVar2;
  }
  this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
  json_exception::json_exception(this_00,cant_compare_raw_e);
  __cxa_throw(this_00,&json_exception::typeinfo,std::exception::~exception);
}

Assistant:

bool json::string_equal(const json &other) const
{
    if (m_raw_value.size() == 0 && other.m_raw_value.size() == 0)
    {
        return m_value.u_string == other.m_value.u_string;
    }
    else
    {
        throw json_exception(json_exception::cant_compare_raw_e);
    }
}